

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O1

btScalar FindMaxSeparation(int *edgeIndex,btBox2dShape *poly1,btTransform *xf1,btBox2dShape *poly2,
                          btTransform *xf2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  btScalar *pbVar14;
  ulong uVar15;
  int edge1;
  int edge1_00;
  ulong uVar16;
  int edge1_01;
  float fVar17;
  btScalar bVar18;
  btScalar bVar19;
  btScalar bVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  fVar17 = (poly2->m_centroid).m_floats[0];
  fVar23 = (poly2->m_centroid).m_floats[1];
  fVar25 = (poly2->m_centroid).m_floats[2];
  fVar1 = (poly1->m_centroid).m_floats[0];
  fVar2 = (poly1->m_centroid).m_floats[1];
  fVar3 = (xf1->m_basis).m_el[0].m_floats[0];
  fVar4 = (xf1->m_basis).m_el[0].m_floats[1];
  fVar5 = (poly1->m_centroid).m_floats[2];
  fVar6 = (xf1->m_basis).m_el[0].m_floats[2];
  fVar7 = (xf1->m_basis).m_el[1].m_floats[0];
  fVar8 = (xf1->m_basis).m_el[1].m_floats[1];
  fVar9 = (xf1->m_basis).m_el[1].m_floats[2];
  fVar10 = (xf1->m_basis).m_el[2].m_floats[0];
  fVar11 = (xf1->m_basis).m_el[2].m_floats[1];
  fVar12 = (xf1->m_basis).m_el[2].m_floats[2];
  fVar22 = ((xf2->m_basis).m_el[0].m_floats[2] * fVar25 +
            (xf2->m_basis).m_el[0].m_floats[0] * fVar17 +
            (xf2->m_basis).m_el[0].m_floats[1] * fVar23 + (xf2->m_origin).m_floats[0]) -
           (fVar5 * fVar6 + fVar1 * fVar3 + fVar2 * fVar4 + (xf1->m_origin).m_floats[0]);
  fVar24 = ((xf2->m_basis).m_el[1].m_floats[2] * fVar25 +
            (xf2->m_basis).m_el[1].m_floats[0] * fVar17 +
            (xf2->m_basis).m_el[1].m_floats[1] * fVar23 + (xf2->m_origin).m_floats[1]) -
           (fVar5 * fVar9 + fVar1 * fVar7 + fVar2 * fVar8 + (xf1->m_origin).m_floats[1]);
  fVar17 = (fVar25 * (xf2->m_basis).m_el[2].m_floats[2] +
            fVar17 * (xf2->m_basis).m_el[2].m_floats[0] +
            fVar23 * (xf2->m_basis).m_el[2].m_floats[1] + (xf2->m_origin).m_floats[2]) -
           (fVar5 * fVar12 + fVar1 * fVar10 + fVar2 * fVar11 + (xf1->m_origin).m_floats[2]);
  pbVar14 = poly1->m_normals[0].m_floats + 2;
  uVar16 = 0xffffffff;
  fVar23 = -3.4028235e+38;
  uVar15 = 0;
  do {
    fVar25 = *pbVar14 * (fVar17 * fVar12 + fVar22 * fVar6 + fVar24 * fVar9) +
             ((btVector3 *)(pbVar14 + -2))->m_floats[0] *
             (fVar10 * fVar17 + fVar3 * fVar22 + fVar7 * fVar24) +
             pbVar14[-1] * (fVar11 * fVar17 + fVar4 * fVar22 + fVar8 * fVar24);
    if (fVar23 < fVar25) {
      uVar16 = uVar15 & 0xffffffff;
    }
    edge1_00 = (int)uVar16;
    if (fVar25 <= fVar23) {
      fVar25 = fVar23;
    }
    fVar23 = fVar25;
    uVar15 = uVar15 + 1;
    pbVar14 = pbVar14 + 4;
  } while (uVar15 != 4);
  bVar18 = EdgeSeparation(poly1,xf1,edge1_00,poly2,xf2);
  bVar20 = bVar18;
  if (bVar18 <= 0.0) {
    edge1_01 = 3;
    if (0 < edge1_00) {
      edge1_01 = edge1_00 + -1;
    }
    bVar19 = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
    bVar20 = bVar19;
    if (bVar19 <= 0.0) {
      edge1 = 0;
      if (edge1_00 < 3) {
        edge1 = edge1_00 + 1;
      }
      bVar20 = EdgeSeparation(poly1,xf1,edge1,poly2,xf2);
      if (bVar20 <= 0.0) {
        bVar13 = bVar18 < bVar19;
        bVar21 = bVar19;
        if ((bVar13 && bVar20 < bVar19) || (bVar21 = bVar20, edge1_01 = edge1, bVar18 < bVar20)) {
          do {
            edge1_00 = edge1_01;
            bVar18 = bVar21;
            if (bVar13 && bVar20 < bVar19) {
              edge1_01 = edge1_00 + -1;
              if (edge1_00 < 1) {
                edge1_01 = 3;
              }
            }
            else {
              edge1_01 = edge1_00 + 1;
              if (2 < edge1_00) {
                edge1_01 = 0;
              }
            }
            bVar21 = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
            if (0.0 < bVar21) {
              return bVar21;
            }
          } while (bVar18 < bVar21);
        }
        *edgeIndex = edge1_00;
        bVar20 = bVar18;
      }
    }
  }
  return bVar20;
}

Assistant:

static btScalar FindMaxSeparation(int* edgeIndex,
								 const btBox2dShape* poly1, const btTransform& xf1,
								 const btBox2dShape* poly2, const btTransform& xf2)
{
	int count1 = poly1->getVertexCount();
	const btVector3* normals1 = poly1->getNormals();

	// Vector pointing from the centroid of poly1 to the centroid of poly2.
	btVector3 d = b2Mul(xf2, poly2->getCentroid()) - b2Mul(xf1, poly1->getCentroid());
	btVector3 dLocal1 = b2MulT(xf1.getBasis(), d);

	// Find edge normal on poly1 that has the largest projection onto d.
	int edge = 0;
    btScalar maxDot;
    if( count1 > 0 )
        edge = (int) dLocal1.maxDot( normals1, count1, maxDot);

	// Get the separation for the edge normal.
	btScalar s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
	if (s > 0.0f)
	{
		return s;
	}

	// Check the separation for the previous edge normal.
	int prevEdge = edge - 1 >= 0 ? edge - 1 : count1 - 1;
	btScalar sPrev = EdgeSeparation(poly1, xf1, prevEdge, poly2, xf2);
	if (sPrev > 0.0f)
	{
		return sPrev;
	}

	// Check the separation for the next edge normal.
	int nextEdge = edge + 1 < count1 ? edge + 1 : 0;
	btScalar sNext = EdgeSeparation(poly1, xf1, nextEdge, poly2, xf2);
	if (sNext > 0.0f)
	{
		return sNext;
	}

	// Find the best edge and the search direction.
	int bestEdge;
	btScalar bestSeparation;
	int increment;
	if (sPrev > s && sPrev > sNext)
	{
		increment = -1;
		bestEdge = prevEdge;
		bestSeparation = sPrev;
	}
	else if (sNext > s)
	{
		increment = 1;
		bestEdge = nextEdge;
		bestSeparation = sNext;
	}
	else
	{
		*edgeIndex = edge;
		return s;
	}

	// Perform a local search for the best edge normal.
	for ( ; ; )
	{
		if (increment == -1)
			edge = bestEdge - 1 >= 0 ? bestEdge - 1 : count1 - 1;
		else
			edge = bestEdge + 1 < count1 ? bestEdge + 1 : 0;

		s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
		if (s > 0.0f)
		{
			return s;
		}

		if (s > bestSeparation)
		{
			bestEdge = edge;
			bestSeparation = s;
		}
		else
		{
			break;
		}
	}

	*edgeIndex = bestEdge;
	return bestSeparation;
}